

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXCompiler.cpp
# Opt level: O1

bool Diligent::IsDXILBytecode(void *pBytecode,size_t Size)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  string _msg;
  char (*in_stack_ffffffffffffffc8) [13];
  char local_30 [4];
  uint local_2c;
  string local_28;
  
  if ((0x1f < (long)Size) && (*pBytecode == 0x43425844)) {
    local_2c = (uint)*(ushort *)((long)pBytecode + 0x14);
    if (local_2c == 1) {
      uVar5 = Size + (long)pBytecode;
      uVar3 = (ulong)*(uint *)((long)pBytecode + 0x1c);
      bVar1 = uVar5 < (long)pBytecode + uVar3 * 4 + 0x20;
      bVar2 = bVar1 || uVar3 == 0;
      if (!bVar1 && uVar3 != 0) {
        uVar4 = 0;
        do {
          uVar6 = (ulong)*(uint *)((long)pBytecode + uVar4 * 4 + 0x20);
          if (uVar5 < (long)pBytecode + uVar6 + 8) {
            bVar1 = false;
            bVar2 = false;
          }
          else {
            bVar7 = *(int *)(uVar6 + (long)pBytecode) == 0x4c495844;
            bVar1 = !bVar7;
            bVar2 = (bool)(bVar7 | bVar2);
          }
          if (!bVar1) {
            return bVar2;
          }
          uVar4 = uVar4 + 1;
        } while (uVar3 != uVar4);
      }
    }
    else {
      local_30[0] = '\x01';
      local_30[1] = '\0';
      local_30[2] = '\0';
      local_30[3] = '\0';
      FormatString<char[64],unsigned_int,char[8],unsigned_int,char[13]>
                (&local_28,
                 (Diligent *)"Unable to parse DXIL container: the container major version is ",
                 (char (*) [64])&local_2c,(uint *)0x6dab8e,(char (*) [8])local_30,(uint *)0x6e66ce,
                 in_stack_ffffffffffffffc8);
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(1,local_28._M_dataplus._M_p,0,0,0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_28._M_dataplus._M_p != &local_28.field_2) {
        operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return false;
}

Assistant:

bool IsDXILBytecode(const void* pBytecode, size_t Size)
{
    const uint8_t* data_begin = static_cast<const uint8_t*>(pBytecode);
    const uint8_t* data_end   = data_begin + Size;
    const uint8_t* ptr        = data_begin;

    if (ptr + sizeof(hlsl::DxilContainerHeader) > data_end)
    {
        // No space for the container header
        return false;
    }

    // A DXIL container is composed of a header, a sequence of part lengths, and a sequence of parts.
    // https://github.com/microsoft/DirectXShaderCompiler/blob/master/docs/DXIL.rst#dxil-container-format
    const hlsl::DxilContainerHeader& ContainerHeader = *reinterpret_cast<const hlsl::DxilContainerHeader*>(ptr);
    if (ContainerHeader.HeaderFourCC != hlsl::DFCC_Container)
    {
        // Incorrect FourCC
        return false;
    }

    if (ContainerHeader.Version.Major != hlsl::DxilContainerVersionMajor)
    {
        LOG_WARNING_MESSAGE("Unable to parse DXIL container: the container major version is ", Uint32{ContainerHeader.Version.Major},
                            " while ", Uint32{hlsl::DxilContainerVersionMajor}, " is expected");
        return false;
    }

    // The header is followed by uint32_t PartOffset[PartCount];
    // The offset is to a DxilPartHeader.
    ptr += sizeof(hlsl::DxilContainerHeader);
    if (ptr + sizeof(uint32_t) * ContainerHeader.PartCount > data_end)
    {
        // No space for offsets
        return false;
    }

    const uint32_t* PartOffsets = reinterpret_cast<const uint32_t*>(ptr);
    for (uint32_t part = 0; part < ContainerHeader.PartCount; ++part)
    {
        const uint32_t Offset = PartOffsets[part];
        if (data_begin + Offset + sizeof(hlsl::DxilPartHeader) > data_end)
        {
            // No space for the part header
            return false;
        }

        const hlsl::DxilPartHeader& PartHeader = *reinterpret_cast<const hlsl::DxilPartHeader*>(data_begin + Offset);
        if (PartHeader.PartFourCC == hlsl::DFCC_DXIL)
        {
            // We found DXIL part
            return true;
        }
    }

    return false;
}